

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::
writeImageSamplerDescriptorSetWithTemplate
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,bool withPush,VkPipelineLayout pipelineLayout)

{
  RawUpdateRegistry *this_00;
  ShaderInputInterface SVar1;
  VkDescriptorUpdateTemplateKHR obj;
  undefined7 in_register_00000009;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  VkDescriptorUpdateTemplateEntryKHR updateBinding;
  VkDescriptorImageInfo imageSamplers [2];
  VkDescriptorBufferInfo resultInfo;
  VkDescriptorUpdateTemplateEntryKHR *local_118;
  iterator iStack_110;
  VkDescriptorUpdateTemplateEntryKHR *local_108;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  VkDevice local_e8;
  VkAllocationCallbacks *pVStack_e0;
  Move<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorImageInfo local_b8;
  VkDescriptorImageInfo local_a0;
  VkDescriptorBufferInfo local_80;
  VkDescriptorUpdateTemplateCreateInfoKHR local_68;
  
  local_118 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_110._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_108 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_80.buffer.m_internal =
       (this->m_result).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  local_80.offset = 0;
  local_80.range = 0x40;
  local_b8.sampler.m_internal = 0;
  local_a0.sampler.m_internal = 0;
  if (this->m_isImmutableSampler != true || withPush) {
    local_b8.sampler.m_internal =
         (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
    local_a0.sampler.m_internal =
         (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  }
  local_b8.imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewA.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_b8.imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  local_a0.imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewB.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_a0.imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  local_68.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.descriptorUpdateEntryCount = 0;
  local_68.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_68.templateType = (VkDescriptorUpdateTemplateTypeKHR)CONCAT71(in_register_00000009,withPush)
  ;
  local_68.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_68.set = 0;
  this_00 = &this->m_updateRegistry;
  local_68.descriptorSetLayout.m_internal = layout.m_internal;
  local_68.pipelineLayout.m_internal = pipelineLayout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&local_80);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(this_00,&local_b8);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(this_00,&local_a0);
  local_e8 = (VkDevice)
             *(this->m_updateRegistry).m_updateEntryOffsets.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  uStack_f0._0_4_ = 1;
  uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  pVStack_e0 = (VkAllocationCallbacks *)0x0;
  if (iStack_110._M_current == local_108) {
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
    ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
              ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
  }
  else {
    (iStack_110._M_current)->offset = (deUintptr)local_e8;
    (iStack_110._M_current)->stride = 0;
    (iStack_110._M_current)->dstBinding = 0;
    (iStack_110._M_current)->dstArrayElement = 0;
    (iStack_110._M_current)->descriptorCount = 1;
    (iStack_110._M_current)->descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
    iStack_110._M_current = iStack_110._M_current + 1;
  }
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_e8 = (VkDevice)
               (this->m_updateRegistry).m_updateEntryOffsets.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[1];
    local_f8._0_4_ = 1;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054a4cc;
    }
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_e8 = (VkDevice)
               (this->m_updateRegistry).m_updateEntryOffsets.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[1];
    local_f8._0_4_ = 1;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
    }
    else {
      (iStack_110._M_current)->offset = (deUintptr)local_e8;
      (iStack_110._M_current)->stride = 0;
      (iStack_110._M_current)->dstBinding = 1;
      (iStack_110._M_current)->dstArrayElement = 0;
      (iStack_110._M_current)->descriptorCount = 1;
      (iStack_110._M_current)->descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
      iStack_110._M_current = iStack_110._M_current + 1;
    }
    local_e8 = (VkDevice)
               (this->m_updateRegistry).m_updateEntryOffsets.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[2];
    local_f8._0_4_ = 2;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 1;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x0;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054a4cc;
    }
  }
  else {
    if (SVar1 != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_0054a4cc;
    local_e8 = (VkDevice)
               (this->m_updateRegistry).m_updateEntryOffsets.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[1];
    local_f8._0_4_ = 1;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 2;
    uStack_f0._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    pVStack_e0 = (VkAllocationCallbacks *)0x18;
    if (iStack_110._M_current == local_108) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_118,iStack_110,(VkDescriptorUpdateTemplateEntryKHR *)local_f8);
      goto LAB_0054a4cc;
    }
  }
  (iStack_110._M_current)->offset = (deUintptr)local_e8;
  (iStack_110._M_current)->stride = (deUintptr)pVStack_e0;
  (iStack_110._M_current)->dstBinding = local_f8._0_4_;
  (iStack_110._M_current)->dstArrayElement = local_f8._4_4_;
  (iStack_110._M_current)->descriptorCount = (deUint32)uStack_f0;
  (iStack_110._M_current)->descriptorType = uStack_f0._4_4_;
  iStack_110._M_current = iStack_110._M_current + 1;
LAB_0054a4cc:
  local_68.pDescriptorUpdateEntries = local_118;
  local_68.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_110._M_current - (long)local_118) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_d8,this->m_vki,this->m_device,&local_68,(VkAllocationCallbacks *)0x0);
  local_e8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_e0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_f8 = (undefined1  [8])
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal;
  uStack_f0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.
                deleter,obj);
  }
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device =
       local_e8;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator
       = pVStack_e0;
  *(undefined4 *)
   &(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal
       = local_f8._0_4_;
  *(undefined4 *)
   ((long)&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal + 4) = local_f8._4_4_;
  *(deUint32 *)
   &(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
    m_deviceIface = (deUint32)uStack_f0;
  *(VkDescriptorType *)
   ((long)&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
           m_deviceIface + 4) = uStack_f0._4_4_;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if (!withPush) {
    (*this->m_vki->_vptr_DeviceInterface[0x92])
              (this->m_vki,this->m_device,descriptorSet.m_internal,
               (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object
               .m_internal,
               (this->m_updateRegistry).m_updateEntries.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_118 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler										samplers[2]			=
	{
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo							imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(imageSamplers[0]);
	m_updateRegistry.addWriteObject(imageSamplers[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), sizeof(imageSamplers[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	m_updateTemplate								= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}